

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdDecodeWithContext(INSTRUX *Instrux,ND_UINT8 *Code,ND_SIZET Size,ND_CONTEXT *Context)

{
  ND_OPERAND *pNVar1;
  ND_UINT8 *Code_00;
  ND_UINT32 NVar2;
  byte *pbVar3;
  ND_UINT32 *pNVar4;
  ND_BRANCH_INFO NVar5;
  byte bVar6;
  ND_OPERAND_DECORATOR NVar7;
  anon_struct_4_18_63b3064b_for_Exs aVar8;
  ulong uVar9;
  sbyte sVar10;
  sbyte sVar11;
  ushort uVar12;
  ushort uVar13;
  bool bVar14;
  byte bVar15;
  ushort uVar16;
  NDSTATUS NVar17;
  uint uVar18;
  ND_REG_TYPE NVar19;
  NDSTATUS NVar20;
  ND_SIZET NVar21;
  ulong uVar22;
  anon_union_8_5_2338f8ca_for__INSTRUX_88 aVar23;
  ND_UINT64 NVar24;
  undefined2 uVar25;
  uint uVar26;
  ND_TABLE_OPCODE *pNVar27;
  ulong uVar28;
  byte bVar29;
  ND_UINT8 NVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  ND_REG_SIZE VsibRegSize;
  ND_SIZET NVar35;
  ND_TABLE_EX_M *pNVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  ND_UINT8 *pNVar40;
  byte bVar41;
  uint uVar42;
  ND_OPERAND *Operand;
  ulong uVar43;
  ND_UINT8 RelOffsetSize;
  ND_OPERAND_SIZE bcstSize;
  ND_TABLE_OPCODE *pNVar44;
  bool bVar45;
  bool bVar46;
  ushort *local_70;
  undefined1 local_44;
  
  if ((Context == (ND_CONTEXT *)0x0 || Size == 0) ||
      (Code == (ND_UINT8 *)0x0 || Instrux == (INSTRUX *)0x0)) {
    return 0x80000100;
  }
  uVar18 = (uint)*(undefined8 *)Context;
  if (0x2000 < (uVar18 & 0xf000)) {
    return 0x80000100;
  }
  if (2 < (uVar18 & 0xf)) {
    return 0x80000100;
  }
  if (0x20 < (uVar18 & 0xf0)) {
    return 0x80000100;
  }
  if ((Context->Options & 2) == 0) {
    nd_memset(Instrux,0,0x1e8);
  }
  uVar18 = *(uint *)Instrux;
  uVar26 = *(uint *)Context & 3;
  *(uint *)Instrux = uVar18 & 0xfffffffc | uVar26;
  uVar18 = (uVar18 & 0xfffffff0 | uVar26) + (*(uint *)Context >> 4 & 3) * 4;
  *(uint *)Instrux = uVar18;
  uVar32 = *(uint *)Context >> 4 & 0x30;
  *(uint *)Instrux = uVar18 & 0xffffffcf | uVar32;
  uVar33 = (*(uint *)Context & 0xf000) << 0x10;
  *(uint *)Instrux = uVar18 & 0xfffffcf | uVar32 | uVar33;
  Instrux->FeatMode = Context->field_0x2;
  *(uint *)Instrux = uVar18 & 0xff0ffcf | uVar32 | uVar33;
  NVar21 = 0xf;
  if (Size < 0xf) {
    NVar21 = Size;
  }
  if (Size != 0) {
    NVar35 = 0;
    do {
      Instrux->InstructionBytes[NVar35] = Code[NVar35];
      NVar35 = NVar35 + 1;
    } while (NVar21 != NVar35);
  }
  Code_00 = Instrux->InstructionBytes;
  if (""[Instrux->InstructionBytes[0]] != '\0') {
    bVar29 = 0;
    do {
      NVar17 = 0x80000001;
      if (Size <= bVar29) goto LAB_0015b122;
      bVar41 = Code_00[bVar29];
      NVar30 = ""[bVar41];
      bVar46 = true;
      if (NVar30 == '\x01') {
        bVar45 = false;
        if (bVar41 < 0xf0) {
          uVar43 = (ulong)(bVar41 - 0x2e);
          if (bVar41 - 0x2e < 0x3a) {
            if ((0xc0000000010101U >> (uVar43 & 0x3f) & 1) == 0) {
              if (uVar43 == 0x38) {
                uVar18 = 0x20;
              }
              else {
                if (uVar43 != 0x39) goto LAB_0015b011;
                uVar18 = 0x40;
              }
              goto LAB_0015aefa;
            }
          }
          else {
LAB_0015b011:
            if (bVar41 != 0x26) goto LAB_0015af04;
          }
          if ((((uVar26 != 2) || ((bVar41 & 0xfe) == 100)) ||
              ((bVar41 == 0x3e && ((Instrux->Seg & 0xfe) != 100)))) ||
             ((uVar18 = Instrux->Seg - 0x3e, 0x27 < uVar18 ||
              ((0xc000000001U >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) {
            Instrux->Seg = bVar41;
            uVar18 = 0x400;
            goto LAB_0015aefa;
          }
        }
        else {
          if (bVar41 == 0xf0) {
            uVar18 = 0x80;
          }
          else if (bVar41 == 0xf2) {
            Instrux->Rep = 0xf2;
            uVar18 = 0x100;
          }
          else {
            bVar45 = false;
            if (bVar41 != 0xf3) goto LAB_0015af04;
            Instrux->Rep = 0xf3;
            uVar18 = 0x200;
          }
LAB_0015aefa:
          *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | uVar18;
        }
        bVar46 = false;
        bVar45 = true;
      }
      else {
        if (NVar30 == '\0') goto LAB_0015b0f7;
        bVar45 = false;
      }
LAB_0015af04:
      if ((!bVar46) && ((*(uint *)&Instrux->field_0x5 & 1) != 0)) {
        *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xfffffffe;
        (Instrux->field_73).Rex = (ND_REX)0x0;
        *(byte *)&Instrux->Exs = *(byte *)&Instrux->Exs & 0xf0;
      }
      if ((uVar26 == 2) && (NVar30 == '\x03')) {
        Instrux->field_0x5 = Instrux->field_0x5 | 1;
        *(byte *)&Instrux->field_73 = bVar41;
        halt_baddata();
      }
      if (bVar45) {
        bVar41 = Instrux->Length + 1;
        Instrux->Length = bVar41;
        if (0xf < bVar41) {
          NVar17 = 0x80000003;
          goto LAB_0015b122;
        }
        bVar29 = bVar29 + 1;
      }
    } while (bVar45);
    if (bVar29 < Size) {
      bVar41 = Code_00[bVar29];
      if (""[bVar41] == '\x02') {
        NVar17 = 0x80000101;
        if (bVar41 < 0xc4) {
          if (bVar41 == 0x62) {
            NVar17 = NdFetchEvex(Instrux,Code_00,bVar29,Size);
          }
          else {
            if (bVar41 != 0x8f) goto LAB_0015b122;
            NVar17 = NdFetchXop(Instrux,Code_00,bVar29,Size);
          }
        }
        else if (bVar41 == 0xc4) {
          NVar17 = NdFetchVex3(Instrux,Code_00,bVar29,Size);
        }
        else if (bVar41 == 0xc5) {
          NVar17 = NdFetchVex2(Instrux,Code_00,bVar29,Size);
        }
        else {
          if (bVar41 != 0xd5) goto LAB_0015b122;
          NVar17 = NdFetchRex2(Instrux,Code_00,bVar29,Size);
        }
        if ((int)NVar17 < 0) goto LAB_0015b122;
      }
LAB_0015b0f7:
      uVar18 = Instrux->Length & 0xf;
      *(ulong *)&Instrux->field_0xc =
           (ulong)(uVar18 << 8) |
           *(ulong *)&Instrux->field_0xc & 0xfffff0fffffff0ff | (ulong)uVar18 << 0x28;
      NVar17 = 0;
    }
LAB_0015b122:
    if ((int)NVar17 < 0) {
      return NVar17;
    }
  }
  uVar18 = *(uint *)Instrux;
  switch(uVar18 & 3) {
  case 0:
    uVar18 = (uVar18 & 0xfffffc3f | *(uint *)&Instrux->field_0x5 & 0x40) +
             (*(uint *)&Instrux->field_0x5 & 0x20) * 8;
    break;
  case 1:
    uVar18 = (uVar18 & 0xfffffc3f | *(uint *)&Instrux->field_0x5 & 0x40) +
             (*(uint *)&Instrux->field_0x5 & 0x20) * 8 ^ 0x140;
    break;
  case 2:
    uVar26 = (uint)((*(uint *)&Instrux->field_0x5 & 0x40) == 0) * 0x40 + 0x40 +
             (uVar18 & 0xffffff3f);
    *(uint *)Instrux = uVar26;
    uVar18 = 0x200;
    if (((uint)Instrux->Exs & 1) == 0) {
      uVar18 = (~*(uint *)&Instrux->field_0x5 & 0x20) << 3;
    }
    uVar18 = uVar26 & 0xfffffcff | uVar18;
    break;
  case 3:
    NVar17 = 0x80000101;
    bVar46 = false;
    goto LAB_0015b1b7;
  }
  *(uint *)Instrux = uVar18;
  NVar17 = 0;
  bVar46 = true;
LAB_0015b1b7:
  if (!bVar46) {
    return NVar17;
  }
  NVar17 = 0;
  switch(*(ushort *)&Instrux->field_0x2 & 0xf) {
  case 0:
    if (*(char *)((long)&Instrux->field_73 + 1) < '\0') {
      pNVar44 = &gLegacyMap_opcode_0f_opcode;
    }
    else {
      pNVar44 = &gLegacyMap_opcode;
    }
    goto LAB_0015b239;
  case 1:
    uVar43 = (ulong)((uint)Instrux->Exs >> 9 & 0x1f);
    pNVar36 = &gXopMap_mmmmm;
    break;
  case 2:
    uVar43 = (ulong)((uint)Instrux->Exs >> 9 & 0x1f);
    pNVar36 = &gVexMap_mmmmm;
    break;
  case 3:
    uVar43 = (ulong)((uint)Instrux->Exs >> 9 & 0x1f);
    pNVar36 = &gEvexMap_mmmmm;
    break;
  default:
    pNVar44 = (ND_TABLE_OPCODE *)0x0;
    goto LAB_0015b239;
  }
  pNVar44 = (ND_TABLE_OPCODE *)pNVar36->Table[uVar43];
LAB_0015b239:
  if (pNVar44 == (ND_TABLE_OPCODE *)0x0) {
    local_70 = (ushort *)0x0;
  }
  else {
    uVar18 = 0;
    bVar14 = false;
    bVar45 = false;
    bVar46 = false;
    local_70 = (ushort *)0x0;
    NVar17 = 0;
    do {
      switch(pNVar44->Type) {
      case 0:
        local_70 = (ushort *)pNVar44->Table[0];
        goto LAB_0015b4d5;
      case 1:
        NVar17 = NdFetchOpcode(Instrux,Code_00,Instrux->Length,Size);
        if ((int)NVar17 < 0) goto LAB_0015b4d5;
        uVar43 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
        pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[Instrux->OpCodeBytes[uVar43]];
        NVar17 = 0;
        break;
      case 2:
        if ((((Instrux->field_0x6 & 8) != 0) ||
            (NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
            -1 < (int)NVar17)) &&
           (NVar17 = NdFetchOpcode(Instrux,Code_00,Instrux->Length,Size), -1 < (int)NVar17)) {
          uVar43 = (ulong)uVar18;
          uVar18 = uVar18 + 1;
          uVar43 = (ulong)Instrux->OpCodeBytes[uVar43];
          goto LAB_0015b5f5;
        }
        goto LAB_0015b4d5;
      case 3:
        if (((Instrux->field_0x6 & 8) == 0) &&
           (NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
           (int)NVar17 < 0)) goto LAB_0015b4d5;
        pNVar27 = *(ND_TABLE_OPCODE **)
                   ((long)pNVar44->Table + (ulong)((Instrux->ModRm).ModRm & 0x38));
        break;
      case 4:
        if (((Instrux->field_0x6 & 8) != 0) ||
           (NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
           -1 < (int)NVar17)) {
          uVar43 = (ulong)(0xbf < (Instrux->ModRm).ModRm);
          goto LAB_0015b5f5;
        }
        goto LAB_0015b4d5;
      case 5:
        if (((Instrux->field_0x6 & 8) != 0) ||
           (NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
           -1 < (int)NVar17)) {
          uVar43 = (ulong)((Instrux->ModRm).ModRm & 7);
          goto LAB_0015b5f5;
        }
        goto LAB_0015b4d5;
      case 6:
        if (Instrux->Rep == 0xf2 && !bVar45) {
          pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[3];
          *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 | 1;
          bVar45 = true;
        }
        else if (Instrux->Rep == 0xf3 && !bVar14) {
          pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[2];
          *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 | 2;
          bVar14 = true;
        }
        else {
          if ((*(uint *)&Instrux->field_0x5 & 0x20) == 0) goto LAB_0015b672;
          pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[1];
          *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 0x80000000;
        }
        break;
      case 7:
        uVar43 = (ulong)(*(uint *)Instrux & 3);
        goto LAB_0015b5d0;
      case 8:
        if (((*(uint *)Instrux & 3) != 2) ||
           (((pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[4], pNVar27 == (ND_TABLE_OPCODE *)0x0 ||
             (((Instrux->field_0x5 & 0x20) != 0 && (((uint)Instrux->Exs & 1) == 0)))) &&
            (pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[5], pNVar27 == (ND_TABLE_OPCODE *)0x0)))) {
          uVar43 = (ulong)(*(uint *)Instrux >> 8 & 3);
          goto LAB_0015b5d0;
        }
        break;
      case 9:
        uVar43 = (ulong)(*(uint *)Instrux >> 6 & 3);
LAB_0015b5d0:
        pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[uVar43 + 1];
LAB_0015b5d5:
        if (pNVar27 == (ND_TABLE_OPCODE *)0x0) {
LAB_0015b672:
          pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[0];
        }
        break;
      case 10:
        if ((((((uint)Instrux->Exs & 0x48) != 0) &&
             (pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[1], pNVar27 != (ND_TABLE_OPCODE *)0x0)) ||
            ((((uint)Instrux->Exs & 1) != 0 &&
             (pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[2], pNVar27 != (ND_TABLE_OPCODE *)0x0))))
           || (((((*(uint *)Instrux & 3) == 2 &&
                 (pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[3], pNVar27 != (ND_TABLE_OPCODE *)0x0)
                 ) || ((Instrux->Rep != '\0' &&
                       (((Instrux->Rep == 0xf3 &&
                         (pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[4],
                         pNVar27 != (ND_TABLE_OPCODE *)0x0)) ||
                        (pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[5],
                        pNVar27 != (ND_TABLE_OPCODE *)0x0)))))) ||
               ((((*(uint *)Instrux & 3) == 2 && ((Instrux->field_0x6 & 8) != 0)) &&
                ((((Instrux->ModRm).ModRm & 199) == 5 &&
                 (pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[6], pNVar27 != (ND_TABLE_OPCODE *)0x0)
                 ))))))) break;
        if ((Instrux->field_0x5 & 2) != 0) {
          pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[7];
          if (pNVar27 != (ND_TABLE_OPCODE *)0x0) break;
          if (((uint)Instrux->field_73 & 0x800) != 0) {
            pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[8];
            goto LAB_0015b5d5;
          }
        }
        goto LAB_0015b672;
      case 0xb:
        pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[*(uint *)Instrux >> 0x1c];
        goto LAB_0015b5d5;
      case 0xc:
        pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[1];
        if (((((pNVar27 == (ND_TABLE_OPCODE *)0x0) || ((Instrux->FeatMode & 1) == 0)) &&
             ((pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[2], pNVar27 == (ND_TABLE_OPCODE *)0x0 ||
              ((Instrux->FeatMode & 2) == 0)))) &&
            ((pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[3], pNVar27 == (ND_TABLE_OPCODE *)0x0 ||
             ((Instrux->FeatMode & 4) == 0)))) &&
           ((pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[4], pNVar27 == (ND_TABLE_OPCODE *)0x0 ||
            ((Instrux->FeatMode & 8) == 0)))) goto LAB_0015b672;
        break;
      case 0xd:
        uVar25 = 0x509;
        goto LAB_0015b5ef;
      case 0xe:
        uVar25 = 0x207;
        goto LAB_0015b5ef;
      case 0xf:
        if (((*(uint *)&Instrux->field_0x5 & 0x10) != 0) &&
           (((uint)Instrux->Exs >> 0x15 & 1) != 0 && ((uint)Instrux->Exs & 0x3e00) != 0x800)) {
          if (((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0) &&
             (NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size),
             (int)NVar17 < 0)) goto LAB_0015b4d5;
          if (0xbf < (Instrux->ModRm).ModRm) {
            pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[2];
            if (pNVar27 != (ND_TABLE_OPCODE *)0x0) break;
            pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[1];
            goto LAB_0015b5d5;
          }
        }
        uVar25 = 0x20e;
        goto LAB_0015b5ef;
      case 0x10:
switchD_0015b287_caseD_10:
        uVar43 = (ulong)((uint)Instrux->Exs & 1);
        goto LAB_0015b5f5;
      case 0x11:
        if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2)
        goto switchD_0015b287_caseD_10;
        uVar43 = 0;
        goto LAB_0015b5f5;
      case 0x12:
        uVar25 = 0x11a;
        goto LAB_0015b5ef;
      case 0x13:
        uVar25 = 0x11b;
LAB_0015b5ef:
        uVar43 = (ulong)((uint)Instrux->Exs >> (sbyte)uVar25 &
                        (1 << (sbyte)((ushort)uVar25 >> 8)) - 1U);
LAB_0015b5f5:
        pNVar27 = (ND_TABLE_OPCODE *)pNVar44->Table[uVar43];
        break;
      case 0x14:
        uVar43 = (ulong)((uint)Instrux->Exs >> 0x1c);
        goto LAB_0015b5f5;
      default:
        NVar17 = 0x80000200;
LAB_0015b4d5:
        bVar46 = true;
        pNVar27 = pNVar44;
      }
    } while ((!bVar46) && (pNVar44 = pNVar27, pNVar27 != (ND_TABLE_OPCODE *)0x0));
  }
  if (-1 < (int)NVar17) {
    if (local_70 == (ushort *)0x0) {
      NVar17 = 0x80000002;
    }
    else {
      NVar20 = NVar17;
      if (((*(ulong *)(local_70 + 0x14) & 1) != 0) &&
         ((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0)) {
        bVar29 = Instrux->Length;
        if (((uint)*(ulong *)(local_70 + 0x14) >> 0x11 & 1) == 0) {
          NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,bVar29,Size);
          NVar20 = 0;
        }
        else {
          NVar20 = 0x80000001;
          NVar17 = 0x80000001;
          if (bVar29 < Size) {
            *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 0x800;
            Instrux->ModRm = *(ND_MODRM *)(Instrux->InstructionBytes + bVar29);
            *(ushort *)&Instrux->field_0x14 =
                 *(ushort *)&Instrux->field_0x14 & 0xfff | (ushort)bVar29 << 0xc;
            Instrux->Length = bVar29 + 1;
            NVar20 = 0x80000003;
            NVar17 = 0x80000003;
            if ((byte)(bVar29 + 1) < 0x10) {
              NVar20 = 0;
              NVar17 = 0;
            }
          }
        }
        if ((int)NVar17 < 0) goto LAB_0015b796;
      }
      NVar17 = NVar20;
      uVar43 = *(ulong *)&Instrux->field_0xc;
      uVar18 = (uint)uVar43 >> 0xc & 0xf;
      Instrux->field_99 =
           *(anon_union_1_2_d70d35b6_for__INSTRUX_116 *)
            (Instrux->InstructionBytes + (ulong)uVar18 + 0xf);
      if ((Instrux->Attributes & 0x800) == 0) {
        NVar30 = (char)uVar18 + (char)(uVar43 >> 0x28);
      }
      else {
        NVar30 = Instrux->Length;
      }
      *(ulong *)&Instrux->field_0xc =
           uVar43 & 0xffff0fffffffffff | (ulong)(NVar30 - 1 & 0xf) << 0x2c;
    }
  }
LAB_0015b796:
  if ((int)NVar17 < 0) {
    return NVar17;
  }
  Instrux->Mnemonic = gMnemonics[local_70[2]];
  uVar43 = *(ulong *)(local_70 + 0x14);
  Instrux->Attributes = uVar43;
  Instrux->Instruction = (uint)*local_70;
  Instrux->Category = (uint)(byte)local_70[1];
  Instrux->IsaSet = (uint)*(byte *)((long)local_70 + 3);
  uVar18 = *(uint *)(local_70 + 0x10) & *(uint *)(local_70 + 0xe);
  (Instrux->FlagsAccess).Undefined.Raw = uVar18;
  (Instrux->FlagsAccess).Tested = *(ND_RFLAGS *)(local_70 + 10);
  (Instrux->FlagsAccess).Modified = *(ND_RFLAGS *)(local_70 + 0xc);
  (Instrux->FlagsAccess).Set.Raw = *(uint *)(local_70 + 0xe) ^ uVar18;
  (Instrux->FlagsAccess).Cleared.Raw = uVar18 ^ *(uint *)(local_70 + 0x10);
  Instrux->CpuidFlag = *(ND_CPUID_FLAG *)(local_70 + 0x18);
  Instrux->ValidModes = *(ND_VALID_MODES *)(local_70 + 4);
  Instrux->ValidPrefixes = *(ND_VALID_PREFIXES *)(local_70 + 3);
  bVar29 = (byte)local_70[6];
  (Instrux->ValidDecorators).Raw = bVar29;
  Instrux->FpuFlagsAccess = *(ND_FPU_FLAGS *)(local_70 + 8);
  Instrux->SimdExceptions = *(ND_SIMD_EXCEPTIONS *)(local_70 + 9);
  Instrux->ExceptionType = *(ND_UINT8 *)((long)local_70 + 0xf);
  Instrux->TupleType = (ND_UINT8)local_70[7];
  uVar18 = *(uint *)Instrux;
  uVar32 = (*(byte *)((long)local_70 + 0x11) & 0xf) << 0x18;
  *(uint *)Instrux = uVar18 & 0xf0ffffff | uVar32;
  uVar26 = (uint)uVar43;
  if (((uVar18 & 3) != 2) && ((uVar43 & 0x40000000) != 0)) {
    *(byte *)&Instrux->Exs = *(byte *)&Instrux->Exs & 0xfe;
  }
  uVar33 = *(uint *)&Instrux->field_0x5;
  aVar8 = Instrux->Exs;
  bVar45 = (uVar18 & 0xf0000000) == 0x20000000;
  bVar46 = !bVar45;
  if ((uVar26 & 6) != 2) {
    bVar45 = SUB41((uVar26 & 4) >> 2,0);
  }
  if (((uVar33 & 0x20) == 0) || (bVar41 = 1, (uVar26 >> 0x13 & 1) == 0 && (int)uVar33 < 0)) {
    if (((uint)aVar8 & 0x180) == 0x80) {
      bVar41 = (byte)(uVar43 >> 0x24) & 1;
    }
    else {
      bVar41 = 0;
    }
  }
  switch(uVar18 & 3) {
  case 0:
    if ((uVar43 & 8) != 0) {
LAB_0015b9ff:
      NVar17 = 0x80000009;
      goto LAB_0015ba04;
    }
    break;
  case 1:
    if ((uVar43 & 8) != 0) goto LAB_0015b9ff;
    bVar41 = bVar41 ^ 1;
    break;
  case 2:
    if ((uVar43 & 0x10) != 0) goto LAB_0015b9ff;
    uVar42 = (uint)(bVar41 ^ 1) << 10;
    uVar38 = uVar42;
    if (bVar41 == 0) {
      uVar38 = 0x800;
    }
    if (bVar45 == false) {
      uVar38 = uVar42;
    }
    if (((uVar26 >> 10 & 1) == 0 & aVar8._0_1_) != 0) {
      uVar38 = 0x800;
    }
    if (((byte)((uVar43 & 0xffffffff) >> 1) & 0x7f & bVar46) != 0) {
      uVar38 = 0x800;
    }
    uVar42 = 0x80;
    if ((uVar26 >> 0x1c & 1) == 0) {
      uVar42 = uVar18 & 0xc0;
    }
    uVar38 = uVar42 | uVar18 & 0xf0fff33f | uVar32 | uVar38;
    goto LAB_0015b9cb;
  case 3:
    NVar17 = 0x80000101;
LAB_0015ba04:
    bVar46 = false;
    goto LAB_0015ba0b;
  }
  uVar38 = uVar18 & 0xf0fff3ff | uVar32 | (uint)bVar41 << 10;
LAB_0015b9cb:
  *(uint *)Instrux = uVar38;
  *(ulong *)&Instrux->field_0xc =
       *(ulong *)&Instrux->field_0xc & 0xfffffffffffffff0 |
       (ulong)(*(byte *)((long)&NdParseOperand_wszLut + (ulong)(uVar38 >> 10 & 3)) & 0xf);
  NVar17 = 0;
  bVar46 = true;
LAB_0015ba0b:
  if (!bVar46) {
    return NVar17;
  }
  if ((uVar33 & 0x10) == 0) goto LAB_0015bac2;
  if ((*(uint *)Instrux & 0xf000000) == 0) {
    if ((((uint)Instrux->field_73 & 0x40000) != 0) ||
       (uVar18 = 0x80000046, ((uint)aVar8 >> 0x15 & 1) != 0 && 0xbf < (Instrux->ModRm).ModRm)) {
      if (((uint)aVar8 >> 0x15 & 1) != 0) {
        if ((Instrux->ModRm).ModRm < 0xc0) {
          uVar18 = 0x80000039;
          if ((bVar29 & 0x10) == 0) goto LAB_0015baba;
          uVar33 = uVar33 | 0x400000;
        }
        else {
          if ((bVar29 & 1) != 0) {
            *(uint *)&Instrux->field_0x5 = uVar33 | 0x6000000;
            *(ushort *)&Instrux->field_0x9 =
                 *(ushort *)&Instrux->field_0x9 & 0x9fff | (ushort)((uint)aVar8 >> 1) & 0x6000;
            goto LAB_0015d8c6;
          }
          if ((bVar29 & 2) == 0) {
            uVar18 = 0x80000035;
            if ((uVar26 >> 0x1d & 1) == 0) goto LAB_0015baba;
            uVar33 = uVar33 | 0x40000000;
          }
          else {
            uVar33 = uVar33 | 0x4000000;
          }
        }
        *(uint *)&Instrux->field_0x5 = uVar33;
      }
LAB_0015d8c6:
      if (((uint)aVar8 & 0x3800000) == 0) {
        uVar18 = 0x80000034;
        if ((uVar26 >> 0xd & 1) != 0) goto LAB_0015baba;
LAB_0015d8f2:
        if (((uint)aVar8 >> 0x16 & 1) != 0) {
          uVar18 = 0x80000036;
          if ((bVar29 & 4) != 0) {
            uVar18 = 0x80000038;
            if ((*(uint *)&Instrux->field_0x5 >> 0x17 & 1) != 0) {
              *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 0x1000000;
              goto LAB_0015d8f8;
            }
          }
          goto LAB_0015baba;
        }
LAB_0015d8f8:
        if (((*(uint *)&Instrux->field_0x5 >> 0xd & 1) != 0) &&
           ((*(uint *)&Instrux->field_0xc & 0xf0000) == 0x10000)) {
          *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 0x200000;
        }
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)((uint)aVar8 & 0x3ffffff);
        goto LAB_0015bab8;
      }
      uVar18 = 0x80000033;
      if ((bVar29 & 8) != 0) {
        Instrux->field_0x7 = Instrux->field_0x7 | 0x80;
        goto LAB_0015d8f2;
      }
    }
  }
  else {
    if ((Instrux->FeatMode & 0x10) == 0) {
      uVar18 = 0x80000002;
LAB_0015bab2:
      bVar46 = false;
    }
    else {
      if ((*(byte *)((long)&Instrux->field_73 + 3) & (&DAT_001f8040)[*(uint *)Instrux >> 0x18 & 0xf]
          ) != 0) {
        uVar18 = 0x80000045;
        goto LAB_0015bab2;
      }
      if ((((uint)Instrux->field_73 & 0x40000) == 0) && (0xbf < (Instrux->ModRm).ModRm)) {
        uVar18 = 0x80000046;
        goto LAB_0015bab2;
      }
      uVar18 = (uint)bVar29;
      if ((bVar29 & 0x20) != 0) {
        iVar34 = (uVar33 & 0xf7ffffff) + ((uint)aVar8 & 0x4000000) * 2;
        *(int *)&Instrux->field_0x5 = iVar34;
        uVar18 = CONCAT31((int3)((uint)iVar34 >> 8),bVar29);
      }
      if ((uVar18 & 0x40) != 0) {
        iVar34 = (*(uint *)&Instrux->field_0x5 & 0xefffffff) + ((uint)aVar8 & 0x8000000) * 2;
        *(int *)&Instrux->field_0x5 = iVar34;
        uVar18 = CONCAT31((int3)((uint)iVar34 >> 8),bVar29);
      }
      if ((char)uVar18 < '\0') {
        uVar18 = (*(uint *)&Instrux->field_0x5 & 0xdfffffff) + ((uint)aVar8 & 0x4000000) * 8;
        *(uint *)&Instrux->field_0x5 = uVar18;
      }
      Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)((uint)aVar8 & 0xfc1f3fff);
      bVar46 = true;
    }
    if (bVar46) {
LAB_0015bab8:
      uVar18 = 0;
    }
  }
LAB_0015baba:
  if ((int)uVar18 < 0) {
    return uVar18;
  }
LAB_0015bac2:
  if (((uVar26 >> 0x12 & 1) == 0) || (NVar17 = NdGetVectorLength(Instrux), -1 < (int)NVar17)) {
    bVar29 = *(byte *)((long)local_70 + 0xd);
    Instrux->field_0x39 = bVar29 & 0xf | bVar29 << 4;
    if ((Context->Options & 1) == 0) {
      Instrux->field_0x39 = (*(byte *)((long)local_70 + 0xd) >> 4) + bVar29 & 0xf | bVar29 << 4;
    }
    if ((Instrux->field_0x39 & 0xf) != 0) {
      pNVar1 = Instrux->Operands;
      uVar43 = 0;
      do {
        aVar8 = Instrux->Exs;
        bVar41 = 1;
        bVar29 = aVar8._0_1_;
        if (((uint)aVar8 & 1) != 0) {
          bVar41 = (*(byte *)((long)&Instrux->Attributes + 1) & 4) >> 2;
        }
        NVar30 = Instrux->Length;
        uVar9 = *(ulong *)(local_70 + uVar43 * 4 + 0x1c);
        Instrux->Operands[uVar43].Flags.Flags = (ND_UINT8)(uVar9 >> 0x10);
        bVar15 = (byte)(uVar9 >> 0x18);
        Instrux->Operands[uVar43].Access.Access = bVar15;
        *(byte *)(pNVar1 + uVar43) = *(byte *)(pNVar1 + uVar43) & 0xf | 0xc0;
        uVar18 = (uint)(uVar9 >> 8) & 0xff;
        NVar17 = 0x80000101;
        switch(uVar18) {
        case 1:
        case 0x33:
          VsibRegSize = 0;
          local_44 = 0;
          bVar31 = 0;
          uVar26 = 0;
          goto LAB_0015bf2f;
        case 2:
          bVar31 = *(byte *)Instrux >> 6;
          goto LAB_0015bdf6;
        case 3:
          bVar31 = *(byte *)Instrux >> 4 & 3;
LAB_0015bdf6:
          uVar26 = 2 << bVar31;
          break;
        case 4:
          if ((*(uint *)Instrux & 2) == 0) {
            uVar22 = (ulong)(*(uint *)Instrux >> 10 & 3);
            pNVar40 = "\x04\b";
            goto LAB_0015bf1e;
          }
          goto switchD_0015bb92_default;
        case 5:
          switch(*(uint *)Instrux & 3) {
          case 0:
            uVar26 = 2 - ((Instrux->field_0x5 & 0x20) == 0);
            break;
          case 1:
            bVar46 = (Instrux->field_0x5 & 0x20) == 0;
            uVar26 = bVar46 + 2 + (uint)bVar46;
            break;
          case 2:
            goto switchD_0015bb92_caseD_9;
          case 3:
            goto switchD_0015bb92_default;
          }
          break;
        case 6:
          uVar26 = 1;
          break;
        case 7:
        case 0x14:
        case 0x1f:
          uVar26 = 2;
          break;
        case 8:
        case 0x15:
        case 0x1e:
          uVar26 = 4;
          break;
        case 9:
        case 0x16:
        case 0x1d:
switchD_0015bb92_caseD_9:
          uVar26 = 8;
          break;
        case 10:
          uVar26 = 0x10;
          break;
        case 0xb:
          uVar26 = 0x20;
          break;
        case 0xc:
        case 0x2b:
          uVar26 = 0x40;
          break;
        case 0xd:
          uVar25 = 0x20a;
          goto LAB_0015be16;
        case 0xe:
          uVar26 = *(uint *)Instrux >> 10;
          goto LAB_0015be8c;
        case 0xf:
          uVar26 = *(uint *)Instrux;
LAB_0015be8c:
          uVar22 = (ulong)(uVar26 & 3);
          pNVar40 = "\x04\x04\b\x02\x04\x04\x04\x06\n\x06\x06\n\b\b\x10";
          goto LAB_0015bf1e;
        case 0x10:
          uVar22 = (ulong)(*(uint *)Instrux >> 10 & 3);
          pNVar40 = "\x02\x04\x04\x04\x06\n\x06\x06\n\b\b\x10";
          goto LAB_0015bf1e;
        case 0x11:
          uVar22 = (ulong)(*(uint *)Instrux & 3);
          pNVar40 = "\x06\x06\n\b\b\x10";
          goto LAB_0015bf1e;
        case 0x12:
          uVar22 = (ulong)(*(uint *)Instrux >> 10 & 3);
          pNVar40 = "\x04\x06\n\x06\x06\n\b\b\x10";
          goto LAB_0015bf1e;
        case 0x13:
        case 0x17:
          uVar26 = 10;
          break;
        case 0x18:
          bVar31 = Instrux->field_0x1;
          uVar32 = 0xe;
          uVar26 = 0x1c;
          goto LAB_0015c02f;
        case 0x19:
          bVar31 = Instrux->field_0x1;
          uVar32 = 0x5e;
          uVar26 = 0x6c;
LAB_0015c02f:
          if ((bVar31 & 0xc) == 0) {
            uVar26 = uVar32;
          }
          break;
        case 0x1a:
          uVar22 = (ulong)(*(uint *)Instrux & 3);
          pNVar40 = "\b\b\x10";
          goto LAB_0015bf1e;
        case 0x1b:
        case 0x2c:
          uVar26 = 0x200;
          break;
        case 0x1c:
          uVar26 = 0xfffffffe;
          break;
        case 0x20:
        case 0x21:
        case 0x22:
        case 0x26:
        case 0x28:
          uVar22 = (ulong)(*(uint *)Instrux >> 0xe & 3);
          pNVar40 = "\x10 @\x02\x04\b";
          goto LAB_0015bf1e;
        case 0x23:
          uVar25 = 0x20e;
LAB_0015be16:
          uVar22 = (ulong)(*(uint *)Instrux >> (sbyte)uVar25 &
                          (1 << (sbyte)((ushort)uVar25 >> 8)) - 1U);
          pNVar40 = "\x02\x04\b";
          goto LAB_0015bf1e;
        case 0x24:
          uVar22 = (ulong)(*(uint *)Instrux >> 0xe & 3);
          pNVar40 = "\x04\b\x10\b\x10 \x10 @\x02\x04\b";
          goto LAB_0015bf1e;
        case 0x25:
          uVar22 = (ulong)(*(uint *)Instrux >> 0xe & 3);
          pNVar40 = "\b\x10 \x10 @\x02\x04\b";
LAB_0015bf1e:
          uVar26 = (uint)pNVar40[uVar22];
          break;
        case 0x27:
          if ((*(uint *)Instrux & 0xc000) != 0) {
            uVar22 = (ulong)(*(uint *)Instrux >> 0xe & 3);
            pNVar40 = "";
            goto LAB_0015bf1e;
          }
          goto switchD_0015bb92_default;
        case 0x29:
          uVar26 = 0x400;
          break;
        case 0x2a:
          uVar26 = 0x30;
          break;
        case 0x2d:
        case 0x2e:
        case 0x2f:
        case 0x30:
        case 0x31:
          iVar34 = (uint)(uVar18 != 0x30) * 3 + 5;
          if ((byte)(uVar18 - 0x2d) < 3) {
            iVar34 = (uVar18 - 0x2d & 0xff) + 2;
          }
          uVar26 = (uint)*(byte *)((long)&NdParseOperand_wszLut +
                                  (ulong)(*(uint *)Instrux >> 10 & 3)) * iVar34;
          break;
        case 0x32:
          uVar26 = 0xc;
          break;
        case 0x34:
        case 0x35:
        case 0x36:
          uVar32 = (uint)aVar8 >> 0xe & 3;
          uVar26 = 4;
          if (uVar32 != 0) {
            uVar26 = (uint)(byte)((uVar32 != 1) * '\b' + 8);
          }
          VsibRegSize = 0x10;
          if (uVar18 != 0x34) {
            VsibRegSize = (uint)(uVar18 != 0x35) * 0x20 + 0x20;
          }
          goto LAB_0015c06e;
        case 0x37:
          uVar32 = (uint)aVar8 >> 0xe & 3;
          uVar26 = 2;
          if (uVar32 != 0) {
            uVar26 = (uint)(byte)((uVar32 != 1) * '\x04' + 4);
          }
          VsibRegSize = (uint)(1 < uVar32) * 0x10 + 0x10;
LAB_0015c06e:
          bVar31 = (byte)uVar26;
LAB_0015c075:
          uVar26 = uVar26 << (bVar41 ^ 3);
          local_44 = 4;
          goto LAB_0015bf2f;
        case 0x38:
          uVar32 = (uint)aVar8 >> 0xe & 3;
          uVar26 = 4;
          if (uVar32 != 0) {
            uVar26 = (uint)(byte)((uVar32 != 1) * '\b' + 8);
          }
          bVar31 = (byte)uVar26;
          VsibRegSize = 0x10;
          if (uVar32 != 0) {
            VsibRegSize = (uint)(uVar32 != 1) * 0x20 + 0x20;
          }
          goto LAB_0015c075;
        case 0x39:
        case 0x3a:
        case 0x3b:
          uVar32 = (uint)aVar8 >> 0xe & 3;
          uVar26 = 2;
          if (uVar32 != 0) {
            uVar26 = (uint)(byte)((uVar32 != 1) * '\x04' + 4);
          }
          VsibRegSize = 0x10;
          if (uVar18 != 0x39) {
            VsibRegSize = (uint)(uVar18 != 0x3a) * 0x20 + 0x20;
          }
          goto LAB_0015becd;
        case 0x3c:
          uVar32 = (uint)aVar8 >> 0xe & 3;
          uVar26 = 1;
          if (uVar32 != 0) {
            uVar26 = (uint)(byte)((uVar32 != 1) * '\x02' + 2);
          }
          VsibRegSize = (uint)(1 < uVar32) * 0x10 + 0x10;
LAB_0015becd:
          bVar31 = (byte)uVar26;
LAB_0015bed4:
          uVar26 = uVar26 << (bVar41 ^ 3);
          local_44 = 8;
          goto LAB_0015bf2f;
        case 0x3d:
          uVar32 = (uint)aVar8 >> 0xe & 3;
          uVar26 = 2;
          if (uVar32 != 0) {
            uVar26 = (uint)(byte)((uVar32 != 1) * '\x04' + 4);
          }
          bVar31 = (byte)uVar26;
          VsibRegSize = 0x10;
          if (uVar32 != 0) {
            VsibRegSize = (uint)(uVar32 != 1) * 0x20 + 0x20;
          }
          goto LAB_0015bed4;
        case 0x3e:
          uVar26 = 0xffffffff;
          break;
        default:
          goto switchD_0015bb92_default;
        }
        VsibRegSize = 0;
        local_44 = 0;
        bVar31 = 0;
LAB_0015bf2f:
        Operand = pNVar1 + uVar43;
        Operand->Size = uVar26;
        if (0x69 < (byte)uVar9) goto switchD_0015bb92_default;
        uVar22 = uVar9 >> 0x20;
        uVar32 = (uint)uVar9 & 0xff;
        RelOffsetSize = (ND_UINT8)uVar26;
        switch(uVar9 & 0xff) {
        case 0:
          if (uVar18 == 0x12) {
            NVar20 = NdFetchAddressFar(Instrux,Code_00,NVar30,Size,RelOffsetSize);
            NVar17 = NVar20;
            if (-1 < (int)NVar20) {
              *(undefined1 *)Operand = 0x45;
              (Operand->Info).Address.BaseSeg = (Instrux->field_74).Address.Cs;
              aVar23.Moffset._4_4_ = 0;
              aVar23.Displacement = (Instrux->field_74).Displacement;
LAB_0015d620:
              *(anon_union_8_5_2338f8ca_for__INSTRUX_88 *)&Operand->Info = aVar23;
              goto LAB_0015d65c;
            }
          }
          else {
            NVar20 = NdFetchAddressNear(Instrux,Code_00,NVar30,Size,RelOffsetSize);
            NVar17 = NVar20;
            if (-1 < (int)NVar20) {
              *(undefined1 *)Operand = 0x46;
              aVar23 = Instrux->field_74;
              goto LAB_0015d620;
            }
          }
          goto switchD_0015bb92_default;
        case 1:
          *(undefined1 *)Operand = 0x31;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = (uint)aVar8 >> 0x10 & 0xf;
          (Operand->Info).Register.Reg = uVar18;
          NVar20 = 0;
          if (((uint)aVar8 >> 0x14 & 1) != 0) {
            NVar17 = 0x80000005;
            if ((Instrux->FeatMode & 0x10) == 0) goto switchD_0015bb92_default;
            (Operand->Info).Register.Reg = uVar18 | 0x10;
          }
          goto LAB_0015d65c;
        case 2:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_CR;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = (Instrux->ModRm).ModRm >> 3 & 7 | ((uint)aVar8 & 0x10) + ((uint)aVar8 & 2) * 4;
          (Operand->Info).Register.Reg = uVar18;
          if ((((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x2) &&
             ((Instrux->field_0x5 & 0x80) != 0)) {
            (Operand->Info).Register.Reg = uVar18 | 8;
          }
          uVar18 = (Operand->Info).Register.Reg;
          NVar17 = 0x80000005;
          if ((uVar18 < 9) && ((0x11dU >> (uVar18 & 0x1f) & 1) != 0)) goto LAB_0015d359;
          goto switchD_0015bb92_default;
        case 3:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_DR;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = ((uint)aVar8 & 0x10) + ((uint)aVar8 & 2) * 4;
          (Operand->Info).Register.Reg = (Instrux->ModRm).ModRm >> 3 & 7 | uVar18;
          bVar46 = uVar18 == 0;
          goto LAB_0015d038;
        case 4:
          bVar29 = (Instrux->ModRm).ModRm;
          if (bVar29 < 0xc0) goto LAB_0015d119;
          *(undefined1 *)Operand = 0x21;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = bVar29 & 7 | (uint)aVar8 & 8;
          (Operand->Info).Register.Reg = uVar18;
          if (((uint)aVar8 & 0x40) != 0) {
            NVar17 = 0x80000005;
            if ((Instrux->FeatMode & 0x10) == 0) goto switchD_0015bb92_default;
            (Operand->Info).Register.Reg = uVar18 | 0x10;
          }
          goto LAB_0015cc51;
        case 5:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_FLG;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 0;
          Instrux->RflAccess = Instrux->RflAccess | bVar15;
          break;
        case 6:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar8 & 2) * 4;
          (Operand->Info).Register.Reg = uVar18;
          uVar26 = (uint)aVar8 & 0x10;
          goto LAB_0015cc30;
        case 7:
          *(undefined1 *)Operand = 0x31;
          (Operand->Info).Register.Type = ND_REG_SSE;
          uVar18 = 0x10;
          if (0x10 < uVar26) {
            uVar18 = uVar26;
          }
          (Operand->Info).Register.Size = uVar18;
          uVar25 = 0x510;
          goto LAB_0015cee6;
        case 8:
          NVar20 = NdFetchImmediate(Instrux,Code_00,NVar30,Size,RelOffsetSize);
          NVar17 = NVar20;
          if (-1 < (int)NVar20) {
            if ((Instrux->field_0x7 & 8) == 0) {
              uVar22 = Instrux->Immediate1;
            }
            else {
              uVar22 = (ulong)(Instrux->field_76).Immediate2;
            }
            *(undefined1 *)Operand = 99;
            (Operand->Info).Immediate.RawSize = RelOffsetSize;
            if (((Operand->Flags).Flags & 4) == 0) {
              if (((Operand->Flags).Flags & 2) == 0) {
                (Operand->Info).Immediate.Imm = uVar22;
                goto LAB_0015d65c;
              }
              Operand->Size = Instrux->Operands[0].Size;
              bVar29 = (byte)(uVar26 << 3);
              sVar10 = (bVar29 < 0x41) * ('@' - bVar29);
              uVar28 = (ulong)(-1L << sVar10) >> sVar10;
              sVar10 = (bVar29 < 0x41) * ('@' - bVar29);
              uVar37 = (uVar22 << sVar10) >> sVar10;
            }
            else {
              Operand->Size =
                   (uint)*(byte *)((long)&NdParseOperand_wszLut +
                                  (ulong)(*(uint *)Instrux >> 10 & 3));
              bVar29 = (byte)(uVar26 << 3);
              sVar10 = (bVar29 < 0x41) * ('@' - bVar29);
              uVar28 = (ulong)(-1L << sVar10) >> sVar10;
              sVar10 = (bVar29 < 0x41) * ('@' - bVar29);
              uVar37 = (uVar22 << sVar10) >> sVar10;
            }
            uVar39 = 0;
            if ((uVar22 >> ((ulong)(byte)(bVar29 - 1) & 0x3f) & 1) != 0) {
              uVar39 = ~uVar28;
            }
            (Operand->Info).Immediate.Imm = uVar39 | uVar37;
            goto LAB_0015d65c;
          }
          goto switchD_0015bb92_default;
        case 9:
          NVar20 = NdFetchRelativeOffset(Instrux,Code_00,NVar30,Size,RelOffsetSize);
          NVar17 = NVar20;
          if (-1 < (int)NVar20) {
            Instrux->field_0xa = Instrux->field_0xa | 0x10;
            *(undefined1 *)Operand = 0x44;
            Operand->Size = *(uint *)&Instrux->field_0xc & 0xf;
            bVar29 = (byte)(uVar26 << 3);
            sVar11 = (bVar29 < 0x41) * ('@' - bVar29);
            sVar10 = (bVar29 < 0x21) * (' ' - bVar29);
            (Operand->Info).Immediate.Imm =
                 (ulong)((Instrux->field_74).Displacement >> ((byte)(bVar29 - 1) & 0x1f) & 1) *
                 ~((ulong)(-1L << sVar11) >> sVar11) |
                 (ulong)(((Instrux->field_74).Displacement << sVar10) >> sVar10);
            (Operand->Info).Immediate.RawSize = RelOffsetSize;
            goto LAB_0015d65c;
          }
          goto switchD_0015bb92_default;
        case 10:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          uVar18 = Operand->Size;
          uVar16 = (ushort)(Operand->Info).Register.Type;
          *(ushort *)&Operand->Info = uVar16 | 0x82;
          *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 7 | 0x20;
          (Operand->Info).Memory.BaseSize =
               *(ND_UINT8 *)((long)&NdParseOperand_wszLut + (ulong)(*(uint *)Instrux >> 4 & 3));
          *(ushort *)&Operand->Info = uVar16 | 0x83;
          *(undefined1 *)((long)&Operand->Info + 10) = 0x22;
          NVar20 = 0;
          *(ulong *)&Instrux->field_0xc =
               *(ulong *)&Instrux->field_0xc & 0xffffffffffffff0f |
               (ulong)((uVar18 / ((uint)*(ulong *)&Instrux->field_0xc & 0xf) & 0xf) << 4);
          Instrux->StackAccess = Instrux->StackAccess | bVar15;
          goto LAB_0015d65c;
        case 0xb:
          NVar20 = NdFetchSseImmediate(Instrux,Code_00,NVar30,Size,
                                       (char)(&switchD_0015bf69::switchdataD_00168bb4)[uVar9 & 0xff]
                                       + 0xb4);
          NVar17 = NVar20;
          if (-1 < (int)NVar20) {
            *(undefined1 *)Operand = 0x91;
            (Operand->Info).Register.Type = ND_REG_SSE;
            uVar18 = 0x10;
            if (0x10 < uVar26) {
              uVar18 = uVar26;
            }
            (Operand->Info).Register.Size = uVar18;
            uVar18 = (uint)((Instrux->field_76).Immediate2 >> 4);
            (Operand->Info).Register.Reg = uVar18;
            if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x2) {
              (Operand->Info).Register.Reg = uVar18 & 7;
            }
            goto LAB_0015d65c;
          }
          goto switchD_0015bb92_default;
        case 0xc:
          NVar17 = 0x80000002;
          if ((Instrux->ModRm).ModRm < 0xc0) goto LAB_0015d119;
          goto switchD_0015bb92_default;
        case 0xd:
          bVar29 = (Instrux->ModRm).ModRm;
          NVar17 = 0x80000002;
          if (0xbf < bVar29) {
            *(undefined1 *)Operand = 0x21;
            (Operand->Info).Immediate.Imm = 0x800000004;
            (Operand->Info).Register.Reg = bVar29 & 7;
            goto LAB_0015d359;
          }
          goto switchD_0015bb92_default;
        case 0xe:
          NVar20 = NdFetchMoffset(Instrux,Code_00,NVar30,Size,
                                  (ND_UINT8)(2 << (*(byte *)Instrux >> 6)));
          NVar17 = NVar20;
          if (-1 < (int)NVar20) {
            Instrux->MemoryAccess = Instrux->MemoryAccess | (Operand->Access).Access;
            *(undefined1 *)Operand = 0x42;
            uVar16 = (ushort)(Operand->Info).Register.Type;
            *(ushort *)&Operand->Info = uVar16 | 0x408;
            (Operand->Info).Memory.DispSize = Instrux->field_0xf & 0xf;
            (Operand->Info).Memory.Disp = (ND_UINT64)Instrux->field_74;
            *(ushort *)&Operand->Info = uVar16 | 0x409;
            bVar29 = NdGetSegOverride(Instrux,'\x03');
            *(byte *)((long)&Operand->Info + 10) =
                 *(byte *)((long)&Operand->Info + 10) & 0xf8 | bVar29;
            goto LAB_0015d65c;
          }
          goto switchD_0015bb92_default;
        case 0xf:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Immediate.Imm = 0x800000004;
          NVar19 = (Instrux->ModRm).ModRm >> 3 & ND_REG_DR;
          goto LAB_0015ceeb;
        case 0x10:
          bVar29 = (Instrux->ModRm).ModRm;
          if (bVar29 < 0xc0) goto LAB_0015d119;
          *(undefined1 *)Operand = 0x21;
          NVar24 = 0x800000004;
LAB_0015ce6e:
          (Operand->Info).Immediate.Imm = NVar24;
LAB_0015d354:
          (Operand->Info).Register.Reg = bVar29 & 7;
          goto LAB_0015d359;
        case 0x11:
          bVar29 = (Instrux->ModRm).ModRm;
          if ((bVar29 < 0xc0) && (NVar17 = 0x80000002, (Instrux->Attributes & 0x20000) == 0))
          goto switchD_0015bb92_default;
          *(undefined1 *)Operand = 0x21;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = bVar29 & 7 | (uint)aVar8 & 8;
          (Operand->Info).Register.Reg = uVar18;
          if (((uint)aVar8 & 0x40) == 0) goto LAB_0015cc51;
          goto LAB_0015cc3a;
        case 0x12:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_SEG;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = (Instrux->ModRm).ModRm >> 3 & 7;
          (Operand->Info).Register.Reg = uVar18;
          bVar29 = (byte)uVar18;
          NVar17 = 0x80000005;
          if ((bVar29 < 6) &&
             ((NVar20 = 0, (uVar9 & 0x2000000) == 0 || (NVar17 = 0x8000000b, bVar29 != 1))))
          goto LAB_0015d65c;
          goto switchD_0015bb92_default;
        case 0x13:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_TR;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = (Instrux->ModRm).ModRm >> 3 & 7 | ((uint)aVar8 & 2) << 2;
          bVar46 = ((uint)aVar8 & 2) == 0;
          goto LAB_0015d038;
        case 0x14:
          bVar41 = (Instrux->ModRm).ModRm;
          NVar17 = 0x80000002;
          if (0xbf < bVar41) {
            *(undefined1 *)Operand = 0x21;
            (Operand->Info).Register.Type = ND_REG_SSE;
            uVar18 = 0x10;
            if (0x10 < uVar26) {
              uVar18 = uVar26;
            }
            (Operand->Info).Register.Size = uVar18;
            bVar29 = bVar29 & 8 | bVar41 & 7;
LAB_0015cf34:
            (Operand->Info).Register.Reg = (uint)bVar29;
            NVar20 = 0;
            if ((Instrux->field_0x5 & 0x10) != 0) {
              (Operand->Info).Register.Reg = (uint)bVar29 + ((uint)aVar8 & 4) * 4;
            }
            goto LAB_0015d65c;
          }
          goto switchD_0015bb92_default;
        case 0x15:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_SSE;
          uVar18 = 0x10;
          if (0x10 < uVar26) {
            uVar18 = uVar26;
          }
          (Operand->Info).Register.Size = uVar18;
          uVar18 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar8 & 2) * 4;
          (Operand->Info).Register.Reg = uVar18;
          NVar20 = 0;
          if ((Instrux->field_0x5 & 0x10) != 0) {
            (Operand->Info).Register.Reg = (uint)aVar8 & 0x10 | uVar18;
          }
          goto LAB_0015d65c;
        case 0x16:
          bVar6 = (Instrux->ModRm).ModRm;
          if (0xbf < bVar6) {
            *(undefined1 *)Operand = 0x21;
            (Operand->Info).Register.Type = ND_REG_SSE;
            uVar18 = 0x10;
            if (0x10 < uVar26) {
              uVar18 = uVar26;
            }
            (Operand->Info).Register.Size = uVar18;
            bVar29 = bVar29 & 8 | bVar6 & 7;
            goto LAB_0015cf34;
          }
          goto LAB_0015d119;
        case 0x17:
        case 0x18:
        case 0x4b:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          uVar16 = (ushort)(Operand->Info).Register.Type;
          *(ushort *)&Operand->Info = uVar16 | 2;
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
          bVar41 = (uVar32 != 0x17) << 3 | 0x30;
          *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 7 | bVar41;
          *(ushort *)&Operand->Info = uVar16 & 0xfeff | 3 | (ushort)(uVar32 - 0x17 < 2) << 8;
          if (uVar32 != 0x18) {
            bVar29 = NdGetSegOverride(Instrux,'\x03');
            bVar29 = bVar29 | bVar41;
            goto LAB_0015d4f4;
          }
          *(byte *)((long)&Operand->Info + 10) = bVar41;
          break;
        case 0x19:
          *(undefined1 *)Operand = 0x51;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = (Instrux->field_99).PrimaryOpCode & 7 | (uint)aVar8 & 8;
          (Operand->Info).Register.Reg = uVar18;
          uVar26 = (uint)aVar8 & 0x40;
LAB_0015cc30:
          if (uVar26 != 0) {
LAB_0015cc3a:
            NVar17 = 0x80000005;
            if ((Instrux->FeatMode & 0x10) == 0) goto switchD_0015bb92_default;
            (Operand->Info).Register.Reg = uVar18 | 0x10;
          }
LAB_0015cc51:
          NVar20 = 0;
          bVar46 = false;
          if ((Operand->Info).Register.Size == 1) {
            if ((((Operand->Info).Register.Reg < 4) || ((Instrux->field_0x2 & 0xf) != 0)) ||
               ((*(uint *)&Instrux->field_0x5 & 1) != 0)) {
              bVar46 = false;
            }
            else {
              bVar46 = (*(uint *)&Instrux->field_0x5 & 2) == 0;
            }
          }
          *(byte *)((long)&Operand->Info + 0xd) =
               *(byte *)((long)&Operand->Info + 0xd) & 0xfe | bVar46;
          goto LAB_0015d65c;
        case 0x1a:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_BND;
          (Operand->Info).Register.Size = uVar26;
          NVar2 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar8 & 2) * 4;
          (Operand->Info).Register.Reg = NVar2;
          bVar29 = (byte)NVar2;
          bVar46 = bVar29 < 3;
          bVar45 = bVar29 == 3;
          goto LAB_0015ceba;
        case 0x1b:
          bVar6 = (Instrux->ModRm).ModRm;
          if (bVar6 < 0xc0) goto LAB_0015d119;
          *(undefined1 *)Operand = 0x21;
          (Operand->Info).Register.Type = ND_REG_BND;
          (Operand->Info).Register.Size = uVar26;
          bVar29 = bVar29 & 8 | bVar6 & 7;
          *(uint *)((long)&Operand->Info + 8) = (uint)bVar29;
          NVar17 = 0x80000005;
          if (bVar29 < 4) goto LAB_0015d359;
          goto switchD_0015bb92_default;
        case 0x1c:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_MSK;
          NVar17 = 0x80000005;
          if (((uint)aVar8 & 0x12) == 0) {
            (Operand->Info).Register.Size = 8;
            bVar29 = (Instrux->ModRm).ModRm >> 3;
            goto LAB_0015d354;
          }
          goto switchD_0015bb92_default;
        case 0x1d:
          *(undefined1 *)Operand = 0x31;
          (Operand->Info).Immediate.Imm = 0x80000000a;
          uVar18 = (uint)aVar8 >> 0x10 & 0xf;
          (Operand->Info).Register.Reg = uVar18;
          bVar46 = uVar18 < 7;
          bVar45 = uVar18 == 7;
LAB_0015ceba:
          NVar17 = 0x80000005;
          if (bVar46 || bVar45) goto LAB_0015d359;
          goto switchD_0015bb92_default;
        case 0x1e:
          bVar29 = (Instrux->ModRm).ModRm;
          if (0xbf < bVar29) {
            *(undefined1 *)Operand = 0x21;
            NVar24 = 0x80000000a;
            goto LAB_0015ce6e;
          }
LAB_0015d119:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0x22;
          (Operand->Info).DefaultFlags =
               (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 1);
          if ((undefined1  [488])((undefined1  [488])*Instrux & (undefined1  [488])0xc0) ==
              (undefined1  [488])0x0) {
            NVar20 = NdParseMemoryOperand16(Instrux,Operand);
          }
          else {
            NVar20 = NdParseMemoryOperand3264(Instrux,Operand,VsibRegSize);
          }
          NVar17 = NVar20;
          if (-1 < (int)NVar20) {
            uVar18 = *(uint *)&Instrux->field_0x5;
            if ((uVar18 >> 10 & 1) != 0) {
              bVar29 = *(byte *)((long)&Operand->Info + 10);
              bVar15 = NdGetSegOverride(Instrux,bVar29 & 7);
              *(byte *)((long)&Operand->Info + 10) = bVar29 & 0xf8 | bVar15;
            }
            NVar24 = Instrux->Attributes;
            if ((char)NVar24 < '\0') {
              NVar17 = 0x80000030;
              if ((uVar18 >> 0xc & 1) == 0) goto switchD_0015bb92_default;
              pbVar3 = (byte *)((long)&Operand->Info + 1);
              *pbVar3 = *pbVar3 | 0x40;
              *(undefined1 *)((long)&Operand->Info + 7) = local_44;
              *(byte *)((long)&Operand->Info + 9) = bVar31;
              (Operand->Info).Immediate.RawSize = (ND_UINT8)(uVar26 / bVar31);
            }
            if (((uint)NVar24 >> 0x1b & 1) != 0) {
              NVar17 = 0x80000042;
              if ((uVar18 >> 0xc & 1) == 0) goto switchD_0015bb92_default;
              pbVar3 = (byte *)((long)&Operand->Info + 1);
              *pbVar3 = *pbVar3 | 0x80;
            }
            if ((uVar18 >> 0x16 & 1) != 0) {
              (Operand->Info).DefaultFlags =
                   (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 0x20);
              uVar32 = 4;
              if (((uVar22 & 4) == 0) && (uVar32 = 8, (uVar22 & 8) == 0)) {
                uVar32 = 2;
                if ((uVar22 & 0x40) == 0) {
                  uVar32 = (uint)(bVar41 ^ 1) * 4 + 4;
                }
              }
              Operand->Size = uVar32;
              (Operand->Info).Immediate.RawSize = (ND_UINT8)uVar32;
              *(char *)((long)&Operand->Info + 7) = (char)(uVar26 / uVar32);
            }
            if ((uVar18 >> 0x15 & 1) != 0) {
              (Operand->Info).DefaultFlags =
                   (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 0x10);
              NVar30 = NdGetCompDispSize(Instrux,Operand->Size);
              (Operand->Info).Memory.CompDispSize = NVar30;
            }
            uVar18 = (uint)Instrux->Attributes;
            uVar13 = (ushort)(Operand->Info).Register.Type;
            uVar12 = (ushort)((uVar18 & 0x100) << 5);
            uVar16 = (ushort)(Instrux->Attributes >> 9) & 0x800;
            *(ushort *)&Operand->Info = uVar16 | uVar13 & 0xd7ff | uVar12;
            if ((uVar18 >> 0x15 & 1) != 0) {
              *(ushort *)&Operand->Info = uVar16 | uVar13 & 0xc7fe | uVar12 | 0x1000;
              pbVar3 = (byte *)((long)&Operand->Info + 10);
              *pbVar3 = *pbVar3 & 0xf8;
            }
            if ((uVar18 >> 0x16 & 1) != 0) {
              pbVar3 = (byte *)((long)&Operand->Info + 1);
              *pbVar3 = *pbVar3 | 2;
              (Operand->Info).Memory.ShStkType = '\x01';
            }
            goto LAB_0015d65c;
          }
          goto switchD_0015bb92_default;
        case 0x1f:
          *(undefined1 *)Operand = 0xa1;
          (Operand->Info).Immediate.Imm = 0x80000000a;
          uVar25 = 0x317;
LAB_0015cee6:
          NVar19 = (uint)aVar8 >> (sbyte)uVar25 & (1 << (sbyte)((ushort)uVar25 >> 8)) - ND_REG_GPR;
          goto LAB_0015ceeb;
        case 0x20:
          *(undefined1 *)Operand = 0x12;
          (Operand->Info).DefaultFlags =
               (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 2);
          bVar29 = *(byte *)((long)&Operand->Info + 10) & 7 |
                   (bVar29 & 2) << 5 | (Instrux->ModRm).ModRm & 0x38;
          *(byte *)((long)&Operand->Info + 10) = bVar29;
          if (((uint)aVar8 & 0x10) != 0) {
            NVar17 = 0x80000005;
            if ((Instrux->FeatMode & 0x10) == 0) goto switchD_0015bb92_default;
            *(byte *)((long)&Operand->Info + 10) = bVar29 | 0x80;
          }
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
          (Operand->Info).DefaultFlags =
               (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 1);
          pbVar3 = (byte *)((long)&Operand->Info + 10);
          *pbVar3 = *pbVar3 & 0xf8;
          goto LAB_0015d359;
        case 0x21:
          *(undefined1 *)Operand = 0x22;
          (Operand->Info).DefaultFlags =
               (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 2);
          bVar29 = *(byte *)((long)&Operand->Info + 10) & 7 |
                   (bVar29 & 8 | (Instrux->ModRm).ModRm & 7) << 3;
          *(byte *)((long)&Operand->Info + 10) = bVar29;
          if (((uint)aVar8 & 0x40) != 0) {
            NVar17 = 0x80000005;
            if ((Instrux->FeatMode & 0x10) == 0) goto switchD_0015bb92_default;
            *(byte *)((long)&Operand->Info + 10) = bVar29 | 0x80;
          }
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
          (Operand->Info).DefaultFlags =
               (ND_OPDESC_DEFAULT_FLAGS)((byte)(Operand->Info).DefaultFlags | 1);
          bVar29 = NdGetSegOverride(Instrux,'\x03');
          *(byte *)((long)&Operand->Info + 10) =
               *(byte *)((long)&Operand->Info + 10) & 0xf8 | bVar29;
          break;
        case 0x22:
          *(undefined1 *)Operand = 0x11;
          (Operand->Info).Register.Type = ND_REG_TILE;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = (Instrux->ModRm).ModRm >> 3 & 7;
          bVar46 = ((uint)aVar8 & 0x12) == 0;
          goto LAB_0015d038;
        case 0x23:
          *(undefined1 *)Operand = 0x21;
          (Operand->Info).Register.Type = ND_REG_TILE;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = (Instrux->ModRm).ModRm & 7;
          bVar46 = ((uint)aVar8 & 0x48) == 0;
LAB_0015d038:
          NVar17 = 0x80000005;
          if (bVar46) {
LAB_0015d359:
            NVar20 = 0;
            goto LAB_0015d65c;
          }
          goto switchD_0015bb92_default;
        case 0x24:
          *(undefined1 *)Operand = 0x31;
          (Operand->Info).Register.Type = ND_REG_TILE;
          (Operand->Info).Register.Size = uVar26;
          uVar18 = (uint)aVar8 >> 0x10 & 0xf;
          (Operand->Info).Register.Reg = uVar18;
          NVar17 = 0x80000005;
          if (((uint)aVar8 >> 0x14 & 1) == 0 && uVar18 < 8) goto LAB_0015d359;
          goto switchD_0015bb92_default;
        case 0x25:
          *(undefined1 *)Operand = 0x39;
          (Operand->Info).DefaultFlags =
               (ND_OPDESC_DEFAULT_FLAGS)
               (aVar8._2_1_ & 0xf | (byte)(Operand->Info).DefaultFlags & 0xf0);
          Operand->Size = 0;
          break;
        case 0x26:
          *(undefined1 *)Operand = 0x87;
          (Operand->Info).Immediate.Imm = 1;
          break;
        case 0x27:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_RIP;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 0;
          Instrux->RipAccess = Instrux->RipAccess | bVar15;
          NVar5 = Instrux->BranchInfo;
          bVar29 = (Instrux->Category == ND_CAT_COND_BR) * '\x02';
          Instrux->BranchInfo = (ND_BRANCH_INFO)((byte)NVar5 & 0xfd | 1 | bVar29);
          if (((Instrux->Operands[0].Flags.Flags & 1) != 0) ||
             (bVar41 = 4, 1 < (byte)((*(byte *)pNVar1 & 0xf) - 1))) {
            bVar41 = (Instrux->Category == ND_CAT_RET) << 2;
          }
          Instrux->BranchInfo =
               (ND_BRANCH_INFO)
               (((Instrux->CsAccess & 10) != 0) << 3 | (byte)NVar5 & 0xf1 | 1 | bVar29 | bVar41);
          break;
        case 0x28:
          *(undefined1 *)Operand = 0xc1;
          NVar24 = 0x400000010;
          goto LAB_0015d464;
        case 0x29:
          *(undefined1 *)Operand = 0xc1;
          NVar24 = 0x400000011;
          goto LAB_0015d464;
        case 0x2a:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SSP;
          goto LAB_0015d3f9;
        case 0x2b:
          *(undefined1 *)Operand = 0xc1;
          NVar24 = 0x100000015;
          goto LAB_0015d464;
        case 0x2c:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x100000001;
          (Operand->Info).Register.Reg = 4;
          pbVar3 = (byte *)((long)&Operand->Info + 0xd);
          *pbVar3 = *pbVar3 | 1;
          break;
        case 0x2d:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          goto LAB_0015d3f9;
        case 0x2e:
          *(undefined1 *)Operand = 0xc1;
          NVar19 = ND_REG_GPR;
          goto LAB_0015c774;
        case 0x2f:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          goto LAB_0015d30f;
        case 0x30:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          goto LAB_0015d485;
        case 0x31:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          goto LAB_0015ce14;
        case 0x32:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          goto LAB_0015ce35;
        case 0x33:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 6;
          break;
        case 0x34:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 7;
          break;
        case 0x35:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 8;
          break;
        case 0x36:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 9;
          break;
        case 0x37:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_GPR;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 0xb;
          break;
        case 0x38:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SEG;
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 1;
          Instrux->CsAccess = Instrux->CsAccess | bVar15;
          break;
        case 0x39:
          *(undefined1 *)Operand = 0xc1;
          NVar19 = ND_REG_SEG;
LAB_0015c774:
          (Operand->Info).Register.Type = NVar19;
          (Operand->Info).Register.Size = uVar26;
          goto LAB_0015ceeb;
        case 0x3a:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SEG;
          goto LAB_0015d485;
        case 0x3b:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SEG;
          goto LAB_0015d3f9;
        case 0x3c:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SEG;
LAB_0015ce14:
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 4;
          break;
        case 0x3d:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SEG;
LAB_0015ce35:
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 5;
          break;
        case 0x3e:
          *(undefined1 *)Operand = 0xc1;
          NVar24 = 0xa00000003;
          goto LAB_0015d464;
        case 0x3f:
          *(undefined1 *)Operand = 0x21;
          (Operand->Info).Immediate.Imm = 0xa00000003;
          NVar19 = (Instrux->ModRm).ModRm & ND_REG_DR;
LAB_0015ceeb:
          (Operand->Info).Register.Reg = NVar19;
          break;
        default:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x1000000005;
          (Operand->Info).Register.Reg = uVar32 - 0x40;
          break;
        case 0x48:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          uVar16 = (ushort)(Operand->Info).Register.Type;
          *(ushort *)&Operand->Info = uVar16 | 2;
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
          pbVar3 = (byte *)((long)&Operand->Info + 10);
          *pbVar3 = *pbVar3 & 7;
          *(ushort *)&Operand->Info = uVar16 | 3;
          bVar29 = NdGetSegOverride(Instrux,'\x03');
          goto LAB_0015d4f4;
        case 0x49:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          uVar16 = (ushort)(Operand->Info).Register.Type;
          *(ushort *)&Operand->Info = uVar16 | 2;
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
          *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 7 | 8;
          *(ushort *)&Operand->Info = uVar16 | 3;
          bVar29 = NdGetSegOverride(Instrux,'\x03');
          bVar29 = bVar29 | 8;
          goto LAB_0015d4f4;
        case 0x4a:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          uVar16 = (ushort)(Operand->Info).Register.Type;
          *(ushort *)&Operand->Info = uVar16 | 6;
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
          (Operand->Info).Memory.IndexSize = '\x01';
          *(byte *)((long)&Operand->Info + 10) = *(byte *)((long)&Operand->Info + 10) & 7 | 0x18;
          (Operand->Info).Memory.Index = '\0';
          (Operand->Info).Register.Count = ((Operand->Info).Register.Count & 0xf0) + 1;
          *(ushort *)&Operand->Info = uVar16 | 7;
          bVar29 = NdGetSegOverride(Instrux,'\x03');
          bVar29 = bVar29 | 0x18;
LAB_0015d4f4:
          *(byte *)((long)&Operand->Info + 10) = bVar29;
          break;
        case 0x4c:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          uVar16 = (ushort)(Operand->Info).Register.Type;
          *(ushort *)&Operand->Info = uVar16 | 2;
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 4 & 3));
          *(ushort *)&Operand->Info = uVar16 | 3;
          *(undefined1 *)((long)&Operand->Info + 10) = 0x2a;
          break;
        case 0x4d:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          pbVar3 = (byte *)((long)&Operand->Info + 1);
          *pbVar3 = *pbVar3 | 2;
          (Operand->Info).Memory.ShStkType = '\x02';
          break;
        case 0x4e:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          pbVar3 = (byte *)((long)&Operand->Info + 1);
          *pbVar3 = *pbVar3 | 2;
          (Operand->Info).Memory.ShStkType = '\x03';
          break;
        case 0x4f:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          pbVar3 = (byte *)((long)&Operand->Info + 1);
          *pbVar3 = *pbVar3 | 2;
          (Operand->Info).Memory.ShStkType = '\x04';
          break;
        case 0x50:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          uVar16 = (ushort)(Operand->Info).Register.Type | 2;
          *(ushort *)&Operand->Info = uVar16;
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
          bVar29 = *(byte *)((long)&Operand->Info + 10) & 7 | 0x30;
          goto LAB_0015cdf1;
        case 0x51:
          Instrux->MemoryAccess = Instrux->MemoryAccess | bVar15;
          *(undefined1 *)Operand = 0xc2;
          uVar16 = (ushort)(Operand->Info).Register.Type | 2;
          *(ushort *)&Operand->Info = uVar16;
          (Operand->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
          bVar29 = *(byte *)((long)&Operand->Info + 10) & 7 | 0x38;
LAB_0015cdf1:
          *(byte *)((long)&Operand->Info + 10) = bVar29;
          *(ushort *)&Operand->Info = uVar16 & 0xfffe;
          break;
        case 0x52:
          *(undefined1 *)Operand = 0x93;
          *(ulong *)&Operand->Info = (ulong)((Instrux->field_76).Immediate2 & 3);
          (Operand->Info).Immediate.RawSize = RelOffsetSize;
          break;
        case 0x53:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_CR;
          goto LAB_0015d3f9;
        case 0x54:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SYS;
          (Operand->Info).Register.Size = uVar26;
          goto LAB_0015d5d9;
        case 0x55:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SYS;
LAB_0015d3f9:
          (Operand->Info).Register.Size = uVar26;
          goto LAB_0015d469;
        case 0x56:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SYS;
LAB_0015d30f:
          (Operand->Info).Register.Size = uVar26;
LAB_0015d5b7:
          (Operand->Info).Register.Reg = 2;
          break;
        case 0x57:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Register.Type = ND_REG_SYS;
LAB_0015d485:
          (Operand->Info).Register.Size = uVar26;
          (Operand->Info).Register.Reg = 3;
          break;
        case 0x58:
          *(undefined1 *)Operand = 0xc1;
          NVar24 = 0x20000000e;
          goto LAB_0015d464;
        case 0x59:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x20000000e;
LAB_0015d5d9:
          (Operand->Info).Register.Reg = 1;
          break;
        case 0x5a:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x20000000e;
          goto LAB_0015d5b7;
        case 0x5b:
          *(undefined1 *)Operand = 0xb1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0xffffffff;
          break;
        case 0x5c:
          *(undefined1 *)Operand = 0xb1;
          (Operand->Info).Immediate.Imm = 0x80000000d;
          (Operand->Info).Register.Reg = 0xff;
          break;
        case 0x5d:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0x10;
          break;
        case 0x5e:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0xc0000103;
          break;
        case 0x5f:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0x176;
          break;
        case 0x60:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0x175;
          break;
        case 0x61:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0x174;
          break;
        case 0x62:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0xc0000081;
          break;
        case 99:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0xc0000082;
          break;
        case 100:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0xc0000084;
          break;
        case 0x65:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0xc0000100;
          break;
        case 0x66:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0xc0000101;
          break;
        case 0x67:
          *(undefined1 *)Operand = 0xc1;
          (Operand->Info).Immediate.Imm = 0x80000000c;
          (Operand->Info).Register.Reg = 0xc0000102;
          break;
        case 0x68:
          *(undefined1 *)Operand = 0xc1;
          NVar24 = 0x80000000d;
LAB_0015d464:
          (Operand->Info).Immediate.Imm = NVar24;
LAB_0015d469:
          (Operand->Info).Register.Reg = 0;
          break;
        case 0x69:
          if ((Instrux->Instruction == ND_INS_PUSHA) || (Instrux->Instruction == ND_INS_POPA)) {
            *(undefined1 *)Operand = 0xc1;
            uVar18 = *(uint *)&Instrux->field_0xc & 0xf;
            Operand->Size = uVar18;
            (Operand->Info).Register.Type = ND_REG_GPR;
            (Operand->Info).Register.Size = uVar18;
            (Operand->Info).Register.Reg = 0;
            (Operand->Info).Register.Count = '\b';
            pbVar3 = (byte *)((long)&Operand->Info + 0xd);
            *pbVar3 = *pbVar3 | 2;
          }
          else {
            *(undefined1 *)Operand = 200;
          }
        }
        NVar20 = 0;
LAB_0015d65c:
        if ((undefined1  [32])((undefined1  [32])*Operand & (undefined1  [32])0xf) ==
            (undefined1  [32])0x1) {
          uVar18 = (uint)(uVar9 >> 0x28) & 0xff;
          if (uVar18 == 0) {
            (Operand->Info).Register.Count = '\x01';
          }
          else {
            (Operand->Info).Register.Count = (ND_UINT8)(uVar9 >> 0x28);
            pNVar4 = &(Operand->Info).Register.Reg;
            *pNVar4 = *pNVar4 & -uVar18;
            pbVar3 = (byte *)((long)&Operand->Info + 0xd);
            *pbVar3 = *pbVar3 | 2;
          }
          if ((((Instrux->field_0x8 & 0x28) != 0) && (((Operand->Access).Access & 2) != 0)) &&
             (((Operand->Flags).Flags & 1) == 0)) {
            pbVar3 = (byte *)((long)&Operand->Info + 0xd);
            *pbVar3 = *pbVar3 | 4;
          }
        }
        NVar17 = NVar20;
        if ((char)(uVar9 >> 0x20) != '\0') {
          if (((uVar9 & 0x100000000) != 0) && ((Instrux->field_0x7 & 0x80) != 0)) {
            NVar7 = Operand->Decorator;
            Operand->Decorator = (ND_OPERAND_DECORATOR)((byte)NVar7 | 1);
            Operand->Decorator =
                 (ND_OPERAND_DECORATOR)
                 ((byte)NVar7 & 199 | 1 | (byte)((uint)Instrux->Exs >> 0x14) & 0x38);
          }
          if (((uVar9 & 0x200000000) != 0) && ((Instrux->field_0x8 & 1) != 0)) {
            NVar17 = 0x80000037;
            if ((undefined1  [32])((undefined1  [32])*Operand & (undefined1  [32])0xf) ==
                (undefined1  [32])0x2) goto switchD_0015bb92_default;
            Operand->Decorator = (ND_OPERAND_DECORATOR)((byte)Operand->Decorator | 2);
          }
          NVar17 = NVar20;
          if (((uVar9 & 0x4c00000000) != 0) && ((Instrux->field_0x7 & 0x40) != 0)) {
            Operand->Decorator = (ND_OPERAND_DECORATOR)((byte)Operand->Decorator | 4);
          }
        }
switchD_0015bb92_default:
        if ((int)NVar17 < 0) {
          return NVar17;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 < ((byte)Instrux->field_0x39 & 0xf));
    }
    if ((Instrux->field_0x2 & 0xf) == 0) {
      NVar17 = NdLegacyPrefixChecks(Instrux);
    }
    else {
      NVar17 = NdVexExceptionChecks(Instrux);
    }
    if (-1 < (int)NVar17) {
      NVar17 = 0;
    }
  }
  return NVar17;
}

Assistant:

NDSTATUS
NdDecodeWithContext(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_SIZET Size,
    ND_CONTEXT *Context
    )
{
    NDSTATUS status;
    PND_IDBE pIns;
    ND_UINT32 opIndex;

    // pre-init
    status = ND_STATUS_SUCCESS;
    pIns = (PND_IDBE)ND_NULL;
    opIndex = 0;

    // validate
    if (ND_NULL == Instrux)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_NULL == Code)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (Size == 0)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_NULL == Context)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_CODE_64 < Context->DefCode)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_DATA_64 < Context->DefData)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_VEND_MAX < Context->VendMode)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (0 == (Context->Options & ND_OPTION_SKIP_ZERO_INSTRUX))
    {
        // Initialize with zero.
        nd_memzero(Instrux, sizeof(INSTRUX));
    }

    Instrux->DefCode = (ND_UINT8)Context->DefCode;
    Instrux->DefData = (ND_UINT8)Context->DefData;
    Instrux->DefStack = (ND_UINT8)Context->DefStack;
    Instrux->VendMode = (ND_UINT8)Context->VendMode;
    Instrux->FeatMode = (ND_UINT8)Context->FeatMode;
    Instrux->EncMode = ND_ENCM_LEGACY;  // Assume legacy encoding by default.

    // Fetch the instruction bytes.
    for (opIndex = 0; 
         opIndex < ((Size < ND_MAX_INSTRUCTION_LENGTH) ? Size : ND_MAX_INSTRUCTION_LENGTH); 
         opIndex++)
    {
        Instrux->InstructionBytes[opIndex] = Code[opIndex];
    }

    if (gPrefixesMap[Instrux->InstructionBytes[0]] != ND_PREF_CODE_NONE)
    {
        // Fetch prefixes. We peek at the first byte, to see if it's worth calling the prefix decoder.
        status = NdFetchPrefixes(Instrux, Instrux->InstructionBytes, 0, Size);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    // Get addressing mode & operand size.
    status = NdGetAddrAndOpMode(Instrux);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Start iterating the tables, in order to extract the instruction entry.
    status = NdFindInstruction(Instrux, Instrux->InstructionBytes, Size, &pIns);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Copy information inside the Instrux.
    status = NdCopyInstructionInfo(Instrux, pIns);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Get effective operand mode.
    status = NdGetEffectiveAddrAndOpMode(Instrux);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    if (Instrux->HasEvex)
    {
        // Post-process EVEX encoded instructions. This does two thing:
        // - check and fill in decorator info;
        // - generate error for invalid broadcast/rounding, mask or zeroing bits;
        // - generate error if any reserved bits are set.
        status = NdGetEvexFields(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    if (ND_HAS_VECTOR(Instrux))
    {
        // Get vector length.
        status = NdGetVectorLength(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    Instrux->ExpOperandsCount = ND_EXP_OPS_CNT(pIns->OpsCount);
    Instrux->OperandsCount = Instrux->ExpOperandsCount;

    if (!(Context->Options & ND_OPTION_ONLY_EXPLICIT_OPERANDS))
    {
        Instrux->OperandsCount += ND_IMP_OPS_CNT(pIns->OpsCount);
    }

    // And now decode each operand.
    for (opIndex = 0; opIndex < Instrux->OperandsCount; ++opIndex)
    {
        status = NdParseOperand(Instrux, Instrux->InstructionBytes, Instrux->Length, Size, 
                                opIndex, pIns->Operands[opIndex]);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    if (ND_ENCM_LEGACY == Instrux->EncMode)
    {
        // Do legacy prefix checks. Only available for legacy instructions. For XOP/VEX/EVEX instructions:
        // 1. LOCK, REP, 0x66, REX, REX2 cause #UD (checkd during XOP/VEX/EVEX fetch)
        // 2. Segment prefixes do not have BHINT or DNT semantic
        // 3. 0x67 can be used to override address mode
        // This has to be done after operand parsing, since some #UD conditions depend on them.
        status = NdLegacyPrefixChecks(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }
    else
    {
        // Do XOP/VEX/EVEX encoding checks. Additional #UD conditions, some dependent on encoded registers.
        // This has to be done after operand parsing, since some #UD conditions depend on them.
        status = NdVexExceptionChecks(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    // All done! Instruction successfully decoded!
    return ND_STATUS_SUCCESS;
}